

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_eventfd_test.c
# Opt level: O0

void reset_test(void)

{
  wr_val = wr_val_base;
  rd_val = rd_val_base;
  wr_ret = -1;
  rd_ret = -1;
  rd_val_base = rd_val_base + 1;
  mpp_eventfd_write(data_fd,0);
  mpp_eventfd_read(data_fd,0);
  _mpp_log_l(4,"mpp_eventfd_test","eventfd test on writing %lld -> %lld\n",0,wr_val,rd_val);
  return;
}

Assistant:

void reset_test()
{
    wr_val = wr_val_base;
    rd_val = rd_val_base;
    wr_ret = -1;
    rd_ret = -1;
    rd_val_base++;

    mpp_eventfd_write(data_fd, 0);
    mpp_eventfd_read(data_fd, NULL, 0);

    mpp_log("eventfd test on writing %lld -> %lld\n", wr_val, rd_val);
}